

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clique.cpp
# Opt level: O1

void __thiscall Clique::printSet(Clique *this,ostream *os)

{
  size_type pos;
  int iVar1;
  bool bVar2;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"[",1);
  iVar1 = 0;
  for (pos = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::m_do_find_from
                       (this->alignment_set,0); pos != 0xffffffffffffffff;
      pos = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::find_next
                      (this->alignment_set,pos)) {
    bVar2 = iVar1 != 0;
    iVar1 = iVar1 + -1;
    if (bVar2) {
      std::__ostream_insert<char,std::char_traits<char>>(os,",",1);
    }
    *(undefined8 *)(os + *(long *)(*(long *)os + -0x18) + 0x10) = 3;
    std::ostream::_M_insert<unsigned_long>((ulong)os);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"]",1);
  return;
}

Assistant:

void Clique::printSet(std::ostream& os) {
	os << "[";
	int n = 0;
	for (size_t i=alignment_set->find_first(); i!=alignment_set_t::npos; i=alignment_set->find_next(i)) {
		if (n++>0) os << ",";
		os << setw(3) << i;
	}
	os << "]";
}